

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_0::getTexelBlockSize(deUint32 format)

{
  bool bVar1;
  CompressedTexFormat format_00;
  int iVar2;
  TextureFormat local_10;
  
  bVar1 = glu::isCompressedFormat(format);
  if (bVar1) {
    format_00 = glu::mapGLCompressedTexFormat(format);
    iVar2 = tcu::getBlockSize(format_00);
    return iVar2;
  }
  local_10 = glu::mapGLInternalFormat(format);
  iVar2 = tcu::TextureFormat::getPixelSize(&local_10);
  return iVar2;
}

Assistant:

int getTexelBlockSize (deUint32 format)
{
	if (glu::isCompressedFormat(format))
		return tcu::getBlockSize(glu::mapGLCompressedTexFormat(format));
	else
		return glu::mapGLInternalFormat(format).getPixelSize();
}